

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

bool __thiscall wasm::I64ToI32Lowering::handleUnreachable(I64ToI32Lowering *this,Expression *curr)

{
  bool bVar1;
  Expression **ppEVar2;
  pointer pBVar3;
  Iterator IVar4;
  optional<wasm::Type> type;
  BasicType local_110 [2];
  undefined1 local_108 [12];
  Block *local_f8;
  Block *block;
  Drop *local_e8;
  Expression *child;
  Index local_d8;
  undefined1 local_d0 [8];
  Iterator __end2;
  undefined1 local_b0 [8];
  Iterator __begin2;
  AbstractChildIterator<wasm::ChildIterator> local_90;
  AbstractChildIterator<wasm::ChildIterator> *local_50;
  ChildIterator *__range2;
  undefined1 local_40 [7];
  bool hasUnreachable;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> children;
  Expression *curr_local;
  I64ToI32Lowering *this_local;
  
  children.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  bVar1 = wasm::Type::operator!=
                    (&curr->type,
                     (BasicType *)
                     ((long)&children.
                             super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_40);
    __range2._7_1_ = 0;
    ChildIterator::ChildIterator((ChildIterator *)&local_90,curr);
    local_50 = &local_90;
    IVar4 = AbstractChildIterator<wasm::ChildIterator>::begin(local_50);
    __end2._8_8_ = IVar4.parent;
    __begin2.parent._0_4_ = IVar4.index;
    local_b0 = (undefined1  [8])__end2._8_8_;
    IVar4 = AbstractChildIterator<wasm::ChildIterator>::end(local_50);
    child = (Expression *)IVar4.parent;
    local_d8 = IVar4.index;
    local_d0 = (undefined1  [8])child;
    __end2.parent._0_4_ = local_d8;
    while (bVar1 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator!=
                             ((Iterator *)local_b0,(Iterator *)local_d0), bVar1) {
      ppEVar2 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                          ((Iterator *)local_b0);
      local_e8 = (Drop *)*ppEVar2;
      bVar1 = wasm::Type::isConcrete
                        (&(local_e8->super_SpecificExpression<(wasm::Expression::Id)18>).
                          super_Expression.type);
      if (bVar1) {
        pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                           (&this->builder);
        local_e8 = Builder::makeDrop(pBVar3,(Expression *)local_e8);
      }
      else {
        block._4_4_ = 1;
        bVar1 = wasm::Type::operator==
                          (&(local_e8->super_SpecificExpression<(wasm::Expression::Id)18>).
                            super_Expression.type,(BasicType *)((long)&block + 4));
        if (bVar1) {
          __range2._7_1_ = 1;
        }
      }
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_40,
                 (value_type *)&local_e8);
      AbstractChildIterator<wasm::ChildIterator>::Iterator::operator++((Iterator *)local_b0);
    }
    ChildIterator::~ChildIterator((ChildIterator *)&local_90);
    if ((__range2._7_1_ & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_108);
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._12_4_ = 0;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_payload =
           (_Storage<wasm::Type,_true>)local_108._0_8_;
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_108[8];
      type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Type>._9_3_ = local_108._9_3_;
      local_f8 = Builder::
                 makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                           (pBVar3,(vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
                                    *)local_40,type);
      local_110[0] = unreachable;
      bVar1 = wasm::Type::operator==
                        (&(local_f8->super_SpecificExpression<(wasm::Expression::Id)1>).
                          super_Expression.type,local_110);
      if (!bVar1) {
        __assert_fail("block->type == Type::unreachable",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                      ,0x689,"bool wasm::I64ToI32Lowering::handleUnreachable(Expression *)");
      }
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)local_f8);
      this_local._7_1_ = true;
    }
    block._0_4_ = 1;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool handleUnreachable(Expression* curr) {
    if (curr->type != Type::unreachable) {
      return false;
    }
    std::vector<Expression*> children;
    bool hasUnreachable = false;
    for (auto* child : ChildIterator(curr)) {
      if (child->type.isConcrete()) {
        child = builder->makeDrop(child);
      } else if (child->type == Type::unreachable) {
        hasUnreachable = true;
      }
      children.push_back(child);
    }
    if (!hasUnreachable) {
      return false;
    }
    // This has an unreachable child, so we can replace it with
    // the children.
    auto* block = builder->makeBlock(children);
    assert(block->type == Type::unreachable);
    replaceCurrent(block);
    return true;
  }